

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColPivHouseholderQR.h
# Opt level: O0

void __thiscall
Eigen::ColPivHouseholderQR<Eigen::Matrix<double,3,3,0,3,3>>::
ColPivHouseholderQR<Eigen::Matrix<double,3,3,0,3,3>>
          (ColPivHouseholderQR<Eigen::Matrix<double,3,3,0,3,3>> *this,
          EigenBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *matrix)

{
  long *x;
  Index IVar1;
  EigenBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *matrix_00;
  Index local_68;
  Index local_60;
  Index local_58;
  Index local_50;
  Index local_48;
  Index local_40 [3];
  Index local_28;
  Index local_20;
  EigenBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *local_18;
  EigenBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *matrix_local;
  ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *this_local;
  
  local_18 = matrix;
  matrix_local = (EigenBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this;
  SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>::SolverBase
            ((SolverBase<Eigen::ColPivHouseholderQR<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)this)
  ;
  local_20 = EigenBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::rows(local_18);
  local_28 = EigenBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::cols(local_18);
  Matrix<double,3,3,0,3,3>::Matrix<long,long>((Matrix<double,3,3,0,3,3> *)this,&local_20,&local_28);
  local_40[0] = EigenBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::rows(local_18);
  local_48 = EigenBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::cols(local_18);
  x = std::min<long>(local_40,&local_48);
  Matrix<double,_3,_1,_0,_3,_1>::Matrix<long>((Matrix<double,_3,_1,_0,_3,_1> *)(this + 0x48),x);
  IVar1 = EigenBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::cols(local_18);
  PermutationMatrix<3,_3,_int>::PermutationMatrix
            ((PermutationMatrix<3,_3,_int> *)(this + 0x60),(long)(int)IVar1);
  local_50 = EigenBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::cols(local_18);
  Matrix<long,_1,_3,_1,_1,_3>::Matrix<long>((Matrix<long,_1,_3,_1,_1,_3> *)(this + 0x70),&local_50);
  local_58 = EigenBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::cols(local_18);
  Matrix<double,_1,_3,_1,_1,_3>::Matrix<long>
            ((Matrix<double,_1,_3,_1,_1,_3> *)(this + 0x88),&local_58);
  local_60 = EigenBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::cols(local_18);
  Matrix<double,_1,_3,_1,_1,_3>::Matrix<long>
            ((Matrix<double,_1,_3,_1,_1,_3> *)(this + 0xa0),&local_60);
  local_68 = EigenBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::cols(local_18);
  Matrix<double,_1,_3,_1,_1,_3>::Matrix<long>
            ((Matrix<double,_1,_3,_1,_1,_3> *)(this + 0xb8),&local_68);
  this[0xd0] = (ColPivHouseholderQR<Eigen::Matrix<double,3,3,0,3,3>>)0x0;
  this[0xd1] = (ColPivHouseholderQR<Eigen::Matrix<double,3,3,0,3,3>>)0x0;
  matrix_00 = (EigenBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
              EigenBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::derived(local_18);
  compute<Eigen::Matrix<double,3,3,0,3,3>>(this,matrix_00);
  return;
}

Assistant:

explicit ColPivHouseholderQR(const EigenBase<InputType>& matrix)
      : m_qr(matrix.rows(), matrix.cols()),
        m_hCoeffs((std::min)(matrix.rows(),matrix.cols())),
        m_colsPermutation(PermIndexType(matrix.cols())),
        m_colsTranspositions(matrix.cols()),
        m_temp(matrix.cols()),
        m_colNormsUpdated(matrix.cols()),
        m_colNormsDirect(matrix.cols()),
        m_isInitialized(false),
        m_usePrescribedThreshold(false)
    {
      compute(matrix.derived());
    }